

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageOperators.cpp
# Opt level: O3

void __thiscall
helics::CustomMessageOperator::CustomMessageOperator
          (CustomMessageOperator *this,
          function<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_(std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>)>
          *userMessageFunction)

{
  undefined8 uVar1;
  
  (this->super_FilterOperator)._vptr_FilterOperator =
       (_func_int **)&PTR__CustomMessageOperator_004c0e38;
  *(undefined8 *)&(this->messageFunction).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->messageFunction).super__Function_base._M_functor + 8) = 0;
  (this->messageFunction).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->messageFunction)._M_invoker = userMessageFunction->_M_invoker;
  if ((userMessageFunction->super__Function_base)._M_manager != (_Manager_type)0x0) {
    uVar1 = *(undefined8 *)((long)&(userMessageFunction->super__Function_base)._M_functor + 8);
    *(undefined8 *)&(this->messageFunction).super__Function_base._M_functor =
         *(undefined8 *)&(userMessageFunction->super__Function_base)._M_functor;
    *(undefined8 *)((long)&(this->messageFunction).super__Function_base._M_functor + 8) = uVar1;
    (this->messageFunction).super__Function_base._M_manager =
         (userMessageFunction->super__Function_base)._M_manager;
    (userMessageFunction->super__Function_base)._M_manager = (_Manager_type)0x0;
    userMessageFunction->_M_invoker = (_Invoker_type)0x0;
  }
  return;
}

Assistant:

CustomMessageOperator::CustomMessageOperator(
    std::function<std::unique_ptr<Message>(std::unique_ptr<Message>)> userMessageFunction):
    messageFunction(std::move(userMessageFunction))
{
}